

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void Curl_conn_cf_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  Curl_cfilter *pCVar1;
  
  do {
    pCVar1 = cf;
    if (pCVar1 == (Curl_cfilter *)0x0) goto LAB_00118c2f;
  } while ((((pCVar1->field_0x24 & 1) == 0) && (cf = pCVar1->next, cf != (Curl_cfilter *)0x0)) &&
          ((cf->field_0x24 & 1) == 0));
  do {
    if ((pCVar1->field_0x24 & 2) == 0) break;
    pCVar1 = pCVar1->next;
  } while (pCVar1 != (Curl_cfilter *)0x0);
LAB_00118c2f:
  for (; pCVar1 != (Curl_cfilter *)0x0; pCVar1 = pCVar1->next) {
    (*pCVar1->cft->adjust_pollset)(pCVar1,data,ps);
  }
  return;
}

Assistant:

void Curl_conn_cf_adjust_pollset(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct easy_pollset *ps)
{
  /* Get the lowest not-connected filter, if there are any */
  while(cf && !cf->connected && cf->next && !cf->next->connected)
    cf = cf->next;
  /* Skip all filters that have already shut down */
  while(cf && cf->shutdown)
    cf = cf->next;
  /* From there on, give all filters a chance to adjust the pollset.
   * Lower filters are called later, so they may override */
  while(cf) {
    cf->cft->adjust_pollset(cf, data, ps);
    cf = cf->next;
  }
}